

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O2

EVP_PKEY * PKCS8_parse_encrypted_private_key(CBS *cbs,char *pass,size_t pass_len)

{
  int iVar1;
  EVP_PKEY *pEVar2;
  size_t out_len;
  uint8_t *out;
  CBS epki;
  CBS ciphertext;
  CBS algorithm;
  CBS pki;
  
  iVar1 = CBS_get_asn1(cbs,&epki,0x20000010);
  if ((((iVar1 != 0) && (iVar1 = CBS_get_asn1(&epki,&algorithm,0x20000010), iVar1 != 0)) &&
      (iVar1 = CBS_get_asn1(&epki,&ciphertext,4), iVar1 != 0)) && (epki.len == 0)) {
    iVar1 = pkcs8_pbe_decrypt(&out,&out_len,&algorithm,pass,pass_len,ciphertext.data,ciphertext.len)
    ;
    if (iVar1 != 0) {
      pki.data = out;
      pki.len = out_len;
      pEVar2 = EVP_parse_private_key(&pki);
      OPENSSL_free(out);
      return pEVar2;
    }
    return (EVP_PKEY *)0x0;
  }
  ERR_put_error(0x13,0,0x68,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                ,0x17f);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *PKCS8_parse_encrypted_private_key(CBS *cbs, const char *pass,
                                            size_t pass_len) {
  // See RFC 5208, section 6.
  CBS epki, algorithm, ciphertext;
  if (!CBS_get_asn1(cbs, &epki, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&epki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&epki, &ciphertext, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&epki) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  uint8_t *out;
  size_t out_len;
  if (!pkcs8_pbe_decrypt(&out, &out_len, &algorithm, pass, pass_len,
                         CBS_data(&ciphertext), CBS_len(&ciphertext))) {
    return 0;
  }

  CBS pki;
  CBS_init(&pki, out, out_len);
  EVP_PKEY *ret = EVP_parse_private_key(&pki);
  OPENSSL_free(out);
  return ret;
}